

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O1

void __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
::evalIntegrand(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  EBPlane *pEVar10;
  QuadratureRule *pQVar11;
  int dim;
  long lVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar20;
  int dim_1;
  double c;
  double dVar21;
  double dVar22;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double local_58 [4];
  Real *local_38;
  GpuArray<double,_4U> roots;
  ulong uVar19;
  
  local_58[0] = -0.5;
  pEVar10 = this->phi;
  iVar8 = this->e0;
  dVar2 = (pEVar10->norm).arr[iVar8];
  uVar14 = 1;
  if (((dVar2 != 0.0) || (NAN(dVar2))) && (iVar9 = this->psiCount, 0 < (long)iVar9)) {
    dVar21 = (pEVar10->cent).arr[0];
    dVar3 = (pEVar10->cent).arr[1];
    dVar4 = (pEVar10->norm).arr[0];
    dVar5 = (pEVar10->norm).arr[1];
    dVar6 = (pEVar10->cent).arr[2];
    dVar7 = (pEVar10->norm).arr[2];
    lVar15 = 0;
    do {
      lVar12 = 0;
      do {
        if ((this->free).arr[lVar12] == false) {
          (&stack0x00000008)[lVar12] =
               (double)*(undefined8 *)
                        (&DAT_00782480 +
                        (ulong)(((this->psi).arr[lVar15].bits >> ((uint)lVar12 & 0x1f) & 1) == 0) *
                        8);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      (&stack0x00000008)[iVar8] = -0.5;
      dVar22 = -0.5 - ((in_stack_00000018 - dVar6) * dVar7 +
                      (in_stack_00000010 - dVar3) * dVar5 + (in_stack_00000008 - dVar21) * dVar4) /
                      dVar2;
      if (ABS(dVar22) < 0.5) {
        lVar12 = (long)(int)uVar14;
        uVar14 = uVar14 + 1;
        local_58[lVar12] = dVar22;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar9);
  }
  dVar2 = local_58[1];
  if (uVar14 == 3) {
    if (local_58[2] < local_58[1]) {
      local_58[1] = local_58[2];
      local_58[2] = dVar2;
    }
  }
  local_58[(int)uVar14] = 0.5;
  if (0 < (int)uVar14) {
    iVar9 = this->psiCount;
    pQVar11 = this->f;
    local_38 = &(pQVar11->nodes).arr[0].w;
    uVar16 = 0;
    do {
      dVar2 = local_58[uVar16];
      dVar21 = local_58[uVar16 + 1] - dVar2;
      if (1.1102230246251565e-14 <= dVar21) {
        (&stack0x00000008)[iVar8] = (local_58[uVar16 + 1] + dVar2) * 0.5;
        if (0 < iVar9) {
          dVar3 = (pEVar10->cent).arr[0];
          dVar4 = (pEVar10->cent).arr[1];
          dVar5 = (pEVar10->norm).arr[0];
          dVar6 = (pEVar10->norm).arr[1];
          dVar7 = (pEVar10->cent).arr[2];
          dVar22 = (pEVar10->norm).arr[2];
          lVar15 = 0;
          do {
            lVar12 = 0;
            do {
              if ((this->free).arr[lVar12] == false) {
                (&stack0x00000008)[lVar12] =
                     (double)*(undefined8 *)
                              (&DAT_00782480 +
                              (ulong)(((this->psi).arr[lVar15].bits >> ((uint)lVar12 & 0x1f) & 1) ==
                                     0) * 8);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            bVar13 = ((in_stack_00000018 - dVar7) * dVar22 +
                      (in_stack_00000010 - dVar4) * dVar6 + (in_stack_00000008 - dVar3) * dVar5 <=
                     0.0) * '\x10';
            bVar20 = (this->psi).arr[lVar15].bits & 0x18;
          } while ((bVar20 != bVar13) && (lVar15 = lVar15 + 1, lVar15 < iVar9));
          if (bVar20 == bVar13) goto LAB_0075d7d6;
        }
        uVar18 = (ulong)pQVar11->nnodes;
        lVar15 = 0;
        uVar19 = uVar18;
        do {
          (&stack0x00000008)[iVar8] = *(double *)((long)&DAT_007a6480 + lVar15) * dVar21 + dVar2;
          dVar3 = *(double *)((long)&DAT_007a64a0 + lVar15);
          pdVar1 = (double *)((long)local_38 + lVar15 * 4 + uVar18 * 0x20 + -0x18);
          *pdVar1 = in_stack_00000008;
          pdVar1[1] = in_stack_00000010;
          *(double *)((long)local_38 + lVar15 * 4 + uVar18 * 0x20 + -8) = in_stack_00000018;
          *(double *)((long)local_38 + lVar15 * 4 + uVar18 * 0x20) = dVar3 * dVar21 * w;
          lVar15 = lVar15 + 8;
          uVar17 = (int)uVar19 + 1;
          uVar19 = (ulong)uVar17;
        } while (lVar15 != 0x20);
        pQVar11->nnodes = uVar17;
      }
LAB_0075d7d6:
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar14);
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }